

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateFor(ExpressionTranslateContext *ctx,ExprFor *expression)

{
  uint local_20;
  uint local_1c;
  uint loopContinueId;
  uint loopBreakId;
  ExprFor *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  local_1c = ctx->nextLoopBreakId;
  ctx->nextLoopBreakId = local_1c + 1;
  local_20 = ctx->nextLoopContinueId;
  ctx->nextLoopContinueId = local_20 + 1;
  _loopContinueId = expression;
  expression_local = (ExprFor *)ctx;
  SmallArray<unsigned_int,_32U>::push_back(&ctx->loopBreakIdStack,&local_1c);
  SmallArray<unsigned_int,_32U>::push_back
            ((SmallArray<unsigned_int,_32U> *)&expression_local[2].increment,&local_20);
  Translate((ExpressionTranslateContext *)expression_local,_loopContinueId->initializer);
  Print((ExpressionTranslateContext *)expression_local,";");
  PrintLine((ExpressionTranslateContext *)expression_local);
  PrintIndent((ExpressionTranslateContext *)expression_local);
  Print((ExpressionTranslateContext *)expression_local,"while(");
  Translate((ExpressionTranslateContext *)expression_local,_loopContinueId->condition);
  Print((ExpressionTranslateContext *)expression_local,")");
  PrintLine((ExpressionTranslateContext *)expression_local);
  PrintIndentedLine((ExpressionTranslateContext *)expression_local,"{");
  *(int *)((long)&expression_local->initializer + 4) =
       *(int *)((long)&expression_local->initializer + 4) + 1;
  PrintIndent((ExpressionTranslateContext *)expression_local);
  Translate((ExpressionTranslateContext *)expression_local,_loopContinueId->body);
  Print((ExpressionTranslateContext *)expression_local,";");
  PrintLine((ExpressionTranslateContext *)expression_local);
  Print((ExpressionTranslateContext *)expression_local,"continue_%d:;",(ulong)local_20);
  PrintLine((ExpressionTranslateContext *)expression_local);
  PrintIndentedLine((ExpressionTranslateContext *)expression_local,"// Increment");
  PrintIndent((ExpressionTranslateContext *)expression_local);
  Translate((ExpressionTranslateContext *)expression_local,_loopContinueId->increment);
  Print((ExpressionTranslateContext *)expression_local,";");
  PrintLine((ExpressionTranslateContext *)expression_local);
  *(int *)((long)&expression_local->initializer + 4) =
       *(int *)((long)&expression_local->initializer + 4) + -1;
  PrintIndentedLine((ExpressionTranslateContext *)expression_local,"}");
  Print((ExpressionTranslateContext *)expression_local,"break_%d:",(ulong)local_1c);
  PrintLine((ExpressionTranslateContext *)expression_local);
  PrintIndent((ExpressionTranslateContext *)expression_local);
  SmallArray<unsigned_int,_32U>::pop_back((SmallArray<unsigned_int,_32U> *)&expression_local->body);
  SmallArray<unsigned_int,_32U>::pop_back
            ((SmallArray<unsigned_int,_32U> *)&expression_local[2].increment);
  return;
}

Assistant:

void TranslateFor(ExpressionTranslateContext &ctx, ExprFor *expression)
{
	unsigned loopBreakId = ctx.nextLoopBreakId++;
	unsigned loopContinueId = ctx.nextLoopContinueId++;
	ctx.loopBreakIdStack.push_back(loopBreakId);
	ctx.loopContinueIdStack.push_back(loopContinueId);

	Translate(ctx, expression->initializer);
	Print(ctx, ";");
	PrintLine(ctx);

	PrintIndent(ctx);
	Print(ctx, "while(");
	Translate(ctx, expression->condition);
	Print(ctx, ")");
	PrintLine(ctx);

	PrintIndentedLine(ctx, "{");
	ctx.depth++;
	PrintIndent(ctx);

	Translate(ctx, expression->body);

	Print(ctx, ";");

	PrintLine(ctx);

	Print(ctx, "continue_%d:;", loopContinueId);
	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Increment");

	PrintIndent(ctx);
	Translate(ctx, expression->increment);

	Print(ctx, ";");

	PrintLine(ctx);
	ctx.depth--;
	PrintIndentedLine(ctx, "}");

	Print(ctx, "break_%d:", loopBreakId);
	PrintLine(ctx);
	PrintIndent(ctx);

	ctx.loopBreakIdStack.pop_back();
	ctx.loopContinueIdStack.pop_back();
}